

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gles2::Performance::InvalidShaderCompilerLightCase::generateShaderSources
          (ProgramContext *__return_storage_ptr__,InvalidShaderCompilerLightCase *this,
          int measurementNdx)

{
  LightType in_R8D;
  ShaderValidity local_d4;
  string local_b8;
  string local_98;
  string local_68;
  string local_48;
  ShaderValidity local_28;
  undefined1 local_21;
  ShaderValidity shaderValidity;
  int local_1c;
  deUint32 specID;
  int measurementNdx_local;
  InvalidShaderCompilerLightCase *this_local;
  ProgramContext *result;
  
  local_1c = measurementNdx;
  _specID = this;
  this_local = (InvalidShaderCompilerLightCase *)__return_storage_ptr__;
  shaderValidity =
       InvalidShaderCompilerCase::getSpecializationID
                 (&this->super_InvalidShaderCompilerCase,measurementNdx);
  local_21 = 0;
  InvalidShaderCompilerCase::ProgramContext::ProgramContext(__return_storage_ptr__);
  if ((this->super_InvalidShaderCompilerCase).m_invalidityType == INVALIDITY_INVALID_CHAR) {
    local_d4 = SHADER_VALIDITY_INVALID_CHAR;
  }
  else {
    local_d4 = SHADER_VALIDITY_LAST;
    if ((this->super_InvalidShaderCompilerCase).m_invalidityType == INVALIDITY_SEMANTIC_ERROR) {
      local_d4 = SHADER_VALIDITY_SEMANTIC_ERROR;
    }
  }
  local_28 = local_d4;
  lightVertexTemplate_abi_cxx11_
            (&local_68,(Performance *)(ulong)(uint)this->m_numLights,this->m_isVertexCase & 1,
             SUB41(this->m_lightType,0),in_R8D);
  specializeShaderSource(&local_48,&local_68,shaderValidity,local_28);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  lightFragmentTemplate_abi_cxx11_
            (&local_b8,(Performance *)(ulong)(uint)this->m_numLights,this->m_isVertexCase & 1,
             SUB41(this->m_lightType,0),in_R8D);
  specializeShaderSource(&local_98,&local_b8,shaderValidity,local_28);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

InvalidShaderCompilerCase::ProgramContext InvalidShaderCompilerLightCase::generateShaderSources (int measurementNdx) const
{
	deUint32		specID			= getSpecializationID(measurementNdx);
	ProgramContext	result;
	ShaderValidity	shaderValidity	= m_invalidityType == INVALIDITY_INVALID_CHAR	? SHADER_VALIDITY_INVALID_CHAR
									: m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
									: SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	result.vertShaderSource = specializeShaderSource(lightVertexTemplate(m_numLights, m_isVertexCase, m_lightType), specID, shaderValidity);
	result.fragShaderSource = specializeShaderSource(lightFragmentTemplate(m_numLights, m_isVertexCase, m_lightType), specID, shaderValidity);

	return result;
}